

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::AffineTransform
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZVec<TPZTransform<double>_> *trVec)

{
  TPZCompEl *this_00;
  int dim;
  int iVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  TPZGeoEl *pTVar4;
  TPZTransform<double> *this_01;
  long lVar5;
  long lVar6;
  long lVar7;
  TPZGeoElSide thisgeoside;
  TPZGeoElSide highdim;
  TPZGeoElSide neighgeoside;
  TPZTransform<double> LocalTransf;
  TPZGeoElSide gelside;
  TPZGeoElSide local_588;
  TPZGeoElSide local_570;
  TPZGeoElSide local_558;
  TPZGeoElSide local_540;
  TPZGeoElSide local_528;
  TPZTransform<double> local_510;
  undefined1 local_370 [16];
  int local_360;
  TPZTransform<double> local_1d0;
  
  lVar7 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  (*trVec->_vptr_TPZVec[3])(trVec,lVar7);
  pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
  dim = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3);
  iVar1 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
  if (0 < lVar7) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      this_00 = *(TPZCompEl **)
                 ((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar6);
      if (this_00 != (TPZCompEl *)0x0) {
        pTVar4 = TPZCompEl::Reference(this_00);
        iVar2 = (**(code **)(*(long *)pTVar4 + 0x210))(pTVar4);
        if (iVar2 == dim) {
          TPZTransform<double>::TPZTransform(&local_510,dim);
          local_360 = (**(code **)(*(long *)pTVar4 + 0xf0))(pTVar4);
          local_360 = local_360 + -1;
          local_370._0_8_ = &PTR__TPZGeoElSide_018f8760;
          local_588.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
          local_588.fGeoEl = pTVar3;
          local_588.fSide = iVar1 + -1;
          local_370._8_8_ = pTVar4;
          iVar2 = TPZGeoElSide::NeighbourExists((TPZGeoElSide *)local_370,&local_588);
          if (iVar2 == 0) {
            (**(code **)(*(long *)pTVar3 + 600))(&local_1d0,pTVar3,iVar1 + -1,pTVar4,&local_510);
            TPZTransform<double>::operator=
                      ((TPZTransform<double> *)
                       ((long)(trVec->fStore->fMult).super_TPZFMatrix<double>.fPivot.fExtAlloc +
                       lVar5 + -0x68),&local_1d0);
            this_01 = &local_1d0;
            goto LAB_011cfa27;
          }
          TPZTransform<double>::operator=
                    ((TPZTransform<double> *)
                     ((long)(trVec->fStore->fMult).super_TPZFMatrix<double>.fPivot.fExtAlloc +
                     lVar5 + -0x68),&local_510);
          local_528.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
          local_528.fSide = local_360;
          local_528.fGeoEl = (TPZGeoEl *)local_370._8_8_;
          TPZGeoElSide::SideTransform3
                    (&local_588,&local_528,
                     (TPZTransform<double> *)
                     ((long)(trVec->fStore->fMult).super_TPZFMatrix<double>.fPivot.fExtAlloc +
                     lVar5 + -0x68));
        }
        else {
          TPZTransform<double>::TPZTransform(&local_510,dim);
          local_588.fSide = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
          local_588.fSide = local_588.fSide + -1;
          local_588.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
          local_588.fGeoEl = pTVar3;
          TPZCompElSide::Reference
                    (&local_558,
                     (TPZCompElSide *)
                     ((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar6))
          ;
          local_540.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
          local_540.fSide = local_558.fSide;
          local_540.fGeoEl = local_558.fGeoEl;
          TPZGeoElSide::SideTransform3(&local_588,&local_540,&local_510);
          pTVar4 = local_558.fGeoEl;
          local_570.fSide = (**(code **)(*(long *)local_558.fGeoEl + 0xf0))(local_558.fGeoEl);
          local_570.fSide = local_570.fSide + -1;
          local_570.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
          local_570.fGeoEl = pTVar4;
          TPZGeoElSide::SideToSideTransform((TPZTransform<double> *)local_370,&local_558,&local_570)
          ;
          TPZTransform<double>::Multiply(&local_1d0,(TPZTransform<double> *)local_370,&local_510);
          TPZTransform<double>::operator=
                    ((TPZTransform<double> *)
                     ((long)(trVec->fStore->fMult).super_TPZFMatrix<double>.fPivot.fExtAlloc +
                     lVar5 + -0x68),&local_1d0);
          TPZTransform<double>::~TPZTransform(&local_1d0);
          this_01 = (TPZTransform<double> *)local_370;
LAB_011cfa27:
          TPZTransform<double>::~TPZTransform(this_01);
        }
        TPZTransform<double>::~TPZTransform(&local_510);
      }
      lVar6 = lVar6 + 0x10;
      lVar5 = lVar5 + 0x1a0;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::AffineTransform(TPZVec<TPZTransform<> > &trVec) const
{
    int64_t nel;
    int side, dim, dimmf;
    nel=fElementVec.size();
    trVec.Resize(nel);
    TPZGeoEl *gelmf = Reference();
    dimmf = gelmf->Dimension();
    side = gelmf->NSides()-1;
    TPZGeoEl  *geoel;
    for (int64_t i = 0; i<nel; i++) {
        if (!fElementVec[i]) {
            continue;
        }
        geoel = fElementVec[i].Element()->Reference();
        dim =  geoel->Dimension();
        if (dim == dimmf) {
            TPZTransform<> tr(dim);
            TPZGeoElSide gelside(geoel,geoel->NSides()-1);
            TPZGeoElSide gelmfside(gelmf,side);
            if (gelside.NeighbourExists(gelmfside))
            {
                trVec[i] = tr;
                gelmfside.SideTransform3(gelside, trVec[i]);
            }
            else
            {
                trVec[i] = gelmf->BuildTransform2(side, geoel, tr);
            }
        }
        else
        {
            TPZTransform<> LocalTransf(dimmf);
            TPZGeoElSide thisgeoside(gelmf,gelmf->NSides()-1);
            TPZGeoElSide neighgeoside = fElementVec[i].Reference();
            thisgeoside.SideTransform3(neighgeoside, LocalTransf);
            TPZGeoElSide highdim(neighgeoside.Element(), neighgeoside.Element()->NSides()-1);
            trVec[i] = neighgeoside.SideToSideTransform(highdim).Multiply(LocalTransf);
            
        }
    }
}